

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O1

void do_objs(char *outfile)

{
  bool bVar1;
  bool bVar2;
  FILE *pFVar3;
  objclass *poVar4;
  char *pcVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  short sVar9;
  ulong uVar10;
  size_t __n;
  int iVar11;
  ulong uVar12;
  char *__src;
  int local_4c;
  
  ofp = (FILE *)fopen(outfile,"w+");
  if ((FILE *)ofp == (FILE *)0x0) {
    do_objs_cold_3();
  }
  else {
    fputs("/* This source file is generated by \'makedefs\'.  Do not edit. */\n",(FILE *)ofp);
    fwrite("#ifndef ONAMES_H\n#define ONAMES_H\n\n",0x23,1,(FILE *)ofp);
    iVar11 = 0;
    local_4c = 0;
    cVar7 = '\0';
    bVar2 = false;
    for (uVar10 = 0; (poVar4 = objects, uVar10 == 0 || (objects[uVar10].oc_class != '\x01'));
        uVar10 = uVar10 + 1) {
      sVar9 = (short)uVar10;
      objects[uVar10].oc_descr_idx = sVar9;
      poVar4[uVar10].oc_name_idx = sVar9;
      if (obj_descr[sVar9].oc_name != (char *)0x0) {
        strncpy(&tmpdup_buf,obj_descr[sVar9].oc_name,0x7f);
        if (poVar4[uVar10].oc_class != cVar7) {
          if ((iVar11 != 0) && (iVar11 != 1000)) {
            do_objs_cold_2();
            bVar2 = true;
          }
          cVar7 = objects[uVar10].oc_class;
          iVar11 = 0;
        }
        pcVar5 = &tmpdup_buf;
        cVar8 = tmpdup_buf;
        while (cVar8 != '\0') {
          if ((byte)(cVar8 + 0x9fU) < 0x1a) {
            cVar6 = cVar8 + -0x20;
LAB_00109989:
            *pcVar5 = cVar6;
          }
          else {
            cVar6 = '_';
            if ((byte)(cVar8 + 0xa5U) < 0xe6) goto LAB_00109989;
          }
          cVar8 = pcVar5[1];
          pcVar5 = pcVar5 + 1;
        }
        switch(cVar7) {
        case '\x04':
          pcVar5 = "#define\tRIN_";
          break;
        case '\x05':
          fwrite("#define\t",8,1,(FILE *)ofp);
          if ((*(ushort *)&objects[uVar10].field_0x11 & 0x1f0) != 0x120) goto LAB_00109a7c;
          bVar1 = false;
          fprintf((FILE *)ofp,"FAKE_AMULET_OF_YENDOR\t%d\n",uVar10 & 0xffffffff);
          __n = 0x24;
          goto LAB_00109aa3;
        default:
          fwrite("#define\t",8,1,(FILE *)ofp);
LAB_00109a7c:
          __n = 0x28;
          goto LAB_00109aa0;
        case '\b':
          pcVar5 = "#define\tPOT_";
          break;
        case '\t':
          pcVar5 = "#define\tSCR_";
          break;
        case '\n':
          fwrite("#define\tSPE_",0xc,1,(FILE *)ofp);
          local_4c = local_4c + 1;
          goto LAB_00109a9a;
        case '\v':
          pcVar5 = "#define\tWAN_";
        }
        fwrite(pcVar5,0xc,1,(FILE *)ofp);
LAB_00109a9a:
        __n = 0x24;
LAB_00109aa0:
        bVar1 = true;
LAB_00109aa3:
        pFVar3 = ofp;
        if (bVar1) {
          strncpy(temp,&tmpdup_buf,__n);
          temp[__n] = '\0';
          fprintf((FILE *)pFVar3,"%s\t%d\n",temp,uVar10 & 0xffffffff);
        }
        iVar11 = iVar11 + objects[uVar10].oc_prob;
      }
    }
    if ((iVar11 != 0) && (iVar11 != 1000)) {
      do_objs_cold_1();
      bVar2 = true;
    }
    uVar12 = 1;
    fwrite("#define\tLAST_GEM\t(JADE)\n",0x18,1,(FILE *)ofp);
    fprintf((FILE *)ofp,"#define\tMAXSPELL\t%d\n",(ulong)(local_4c + 1));
    fprintf((FILE *)ofp,"#define\tNUM_OBJECTS\t%d\n",uVar10 & 0xffffffff);
    fwrite("\n/* Artifacts (unique objects) */\n\n",0x23,1,(FILE *)ofp);
    do {
      strncpy(&tmpdup_buf,artifact_names[uVar12],0x7f);
      if (tmpdup_buf != '\0') {
        pcVar5 = &DAT_0014f2b1;
        cVar7 = tmpdup_buf;
        do {
          if ((byte)(cVar7 + 0x9fU) < 0x1a) {
            cVar8 = cVar7 + -0x20;
LAB_00109c24:
            pcVar5[-1] = cVar8;
          }
          else {
            cVar8 = '_';
            if ((byte)(cVar7 + 0xa5U) < 0xe6) goto LAB_00109c24;
          }
          cVar7 = *pcVar5;
          pcVar5 = pcVar5 + 1;
        } while (cVar7 != '\0');
      }
      pcVar5 = &tmpdup_buf;
      if (_tmpdup_buf == 0x5f454854) {
        pcVar5 = &DAT_0014f2b4;
      }
      __src = &DAT_0014f2b9;
      if (_tmpdup_buf == 0x5f454854) {
        __src = &DAT_0014f2bd;
      }
      iVar11 = strncmp(pcVar5,"PLATINUM_",9);
      pFVar3 = ofp;
      if (iVar11 != 0) {
        __src = pcVar5;
      }
      strncpy(temp,__src,0x24);
      temp[0x24] = '\0';
      fprintf((FILE *)pFVar3,"#define\tART_%s\t%d\n",temp,uVar12 & 0xffffffff);
      uVar12 = uVar12 + 1;
    } while (uVar12 != 0x25);
    fprintf((FILE *)ofp,"#define\tNROFARTIFACTS\t%d\n",0x24);
    fwrite("\n#endif /* ONAMES_H */\n",0x17,1,(FILE *)ofp);
    fclose((FILE *)ofp);
    if (!bVar2) {
      return;
    }
  }
  exit(1);
}

Assistant:

void do_objs(const char *outfile)
{
	int i, sum = 0;
	char *c, *objnam;
	int nspell = 0;
	int prefix = 0;
	char class = '\0';
	boolean	sumerr = FALSE;

	if (!(ofp = fopen(outfile, WRTMODE))) {
		perror(outfile);
		exit(EXIT_FAILURE);
	}
	
	fprintf(ofp,"%s",Dont_Edit_Code);
	fprintf(ofp,"#ifndef ONAMES_H\n#define ONAMES_H\n\n");

	for (i = 0; !i || objects[i].oc_class != ILLOBJ_CLASS; i++) {
		objects[i].oc_name_idx = objects[i].oc_descr_idx = i;	/* init */
		if (!(objnam = tmpdup(OBJ_NAME(objects[i])))) continue;

		/* make sure probabilities add up to 1000 */
		if (objects[i].oc_class != class) {
			if (sum && sum != 1000) {
			    fprintf(stderr, "prob error for class %d (%d%%)",
				    class, sum);
			    fflush(stderr);
			    sumerr = TRUE;
			}
			class = objects[i].oc_class;
			sum = 0;
		}

		for (c = objnam; *c; c++)
		    if (*c >= 'a' && *c <= 'z') *c -= (char)('a' - 'A');
		    else if (*c < 'A' || *c > 'Z') *c = '_';

		switch (class) {
		    case WAND_CLASS:
			fprintf(ofp,"#define\tWAN_"); prefix = 1; break;
		    case RING_CLASS:
			fprintf(ofp,"#define\tRIN_"); prefix = 1; break;
		    case POTION_CLASS:
			fprintf(ofp,"#define\tPOT_"); prefix = 1; break;
		    case SPBOOK_CLASS:
			fprintf(ofp,"#define\tSPE_"); prefix = 1; nspell++; break;
		    case SCROLL_CLASS:
			fprintf(ofp,"#define\tSCR_"); prefix = 1; break;
		    case AMULET_CLASS:
			/* avoid trouble with stupid C preprocessors */
			fprintf(ofp,"#define\t");
			if (objects[i].oc_material == PLASTIC) {
			    fprintf(ofp,"FAKE_AMULET_OF_YENDOR\t%d\n", i);
			    prefix = -1;
			    break;
			}
			break;
		    default:
			fprintf(ofp,"#define\t");
		}
		if (prefix >= 0)
			fprintf(ofp,"%s\t%d\n", limit(objnam, prefix), i);
		prefix = 0;

		sum += objects[i].oc_prob;
	}

	/* check last set of probabilities */
	if (sum && sum != 1000) {
	    fprintf(stderr, "prob error for class %d (%d%%)", class, sum);
	    fflush(stderr);
	    sumerr = TRUE;
	}

	fprintf(ofp,"#define\tLAST_GEM\t(JADE)\n");
	fprintf(ofp,"#define\tMAXSPELL\t%d\n", nspell+1);
	fprintf(ofp,"#define\tNUM_OBJECTS\t%d\n", i);

	fprintf(ofp, "\n/* Artifacts (unique objects) */\n\n");

	for (i = 1; artifact_names[i]; i++) {
		for (c = objnam = tmpdup(artifact_names[i]); *c; c++)
		    if (*c >= 'a' && *c <= 'z') *c -= (char)('a' - 'A');
		    else if (*c < 'A' || *c > 'Z') *c = '_';

		if (!strncmp(objnam, "THE_", 4))
			objnam += 4;
		/* fudge _platinum_ YENDORIAN EXPRESS CARD */
		if (!strncmp(objnam, "PLATINUM_", 9))
			objnam += 9;
		fprintf(ofp,"#define\tART_%s\t%d\n", limit(objnam, 1), i);
	}

	fprintf(ofp, "#define\tNROFARTIFACTS\t%d\n", i-1);
	fprintf(ofp,"\n#endif /* ONAMES_H */\n");
	fclose(ofp);
	if (sumerr) exit(EXIT_FAILURE);
	return;
}